

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer>::assemble
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this,string *line)

{
  pointer_____offset_0x10___ *ppuVar1;
  undefined8 *puVar2;
  allocator<char> local_239;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  undefined1 local_200 [48];
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  bool local_1a8;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)line,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_200,(istream_type *)&iss);
  local_1d0 = (undefined1  [8])0x0;
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8 = false;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tokens,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_200,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_1d0,(allocator_type *)&local_238);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)(local_200 + 8));
  if (tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] no instruction token",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 1;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  }
  ppuVar1 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<mvm::assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>>
                      (&traits::instr_set_traits<mvm::test::test_instr_set>::instr_names,
                       &std::bad_optional_access::typeinfo,&tokens);
  if (ppuVar1 == &std::bad_optional_access::typeinfo) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction name",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 2;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch((long)(ppuVar1 + -0x2f0e8) >> 3) {
  case 0:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&mvm::test::test_instr_set::zero,mvm::typestring::type_string<(char)122,(char)101,(char)114,(char)111,(char)0>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
               (assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\0',&tokens);
    break;
  case 1:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_instr<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,true,&mvm::test::test_instr_set::jump,mvm::typestring::type_string<(char)106,(char)117,(char)109,(char)112,(char)0>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
               (assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\x01',&tokens)
    ;
    break;
  case 2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,false,&mvm::test::test_instr_set::dup,mvm::typestring::type_string<(char)100,(char)117,(char)112,(char)0>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
               (assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\x02',&tokens)
    ;
    break;
  case 3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
               (assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\x03',&tokens)
    ;
    break;
  case 4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false,&mvm::test::test_instr_set::randn,mvm::typestring::type_string<(char)114,(char)97,(char)110,(char)100,(char)110,(char)0>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
               (assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\x04',&tokens)
    ;
    break;
  case 5:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::iterable_consumer<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,mvm::count_from<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>>>,mvm::meta_tie<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false,&mvm::test::test_instr_set::rotln,mvm::typestring::type_string<(char)114,(char)111,(char)116,(char)108,(char)110,(char)0>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
               (assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\x05',&tokens)
    ;
    break;
  case 6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&mvm::test::test_instr_set::add,mvm::typestring::type_string<(char)97,(char)100,(char)100,(char)0>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
               (assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\x06',&tokens)
    ;
    break;
  case 7:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 8:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 9:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 10:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x10:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x11:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x12:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x13:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x14:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x15:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x16:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x17:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x18:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x19:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x20:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x21:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x22:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x23:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x24:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x25:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x26:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x27:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x28:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x29:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x30:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x31:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x32:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x33:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x34:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x35:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x36:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x37:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x38:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x39:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x40:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x41:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x42:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x43:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x44:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x45:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x46:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x47:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x48:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x49:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x50:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x51:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x52:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x53:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x54:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x55:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x56:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x57:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x58:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x59:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x60:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x61:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x62:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 99:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 100:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x65:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x66:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x67:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x68:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x69:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x70:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x71:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x72:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x73:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x74:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x75:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x76:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x77:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x78:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x79:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x80:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x81:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x82:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x83:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x84:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x85:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x86:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x87:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x88:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x89:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x90:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x91:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x92:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x93:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x94:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x95:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x96:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x97:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x98:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x99:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9a:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9b:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9c:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9d:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9e:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9f:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa0:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa1:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa2:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa3:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa4:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa5:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa6:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa7:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa8:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa9:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaa:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xab:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xac:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xad:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xae:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaf:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb0:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb1:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb2:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb3:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb4:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb5:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb6:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb7:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb8:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb9:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xba:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbb:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbc:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbd:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbe:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbf:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc0:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc1:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc2:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc3:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc4:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc5:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc6:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 199:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 200:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc9:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xca:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcb:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcc:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcd:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xce:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcf:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd0:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd1:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd2:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd3:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd4:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd5:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd6:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd7:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd8:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd9:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xda:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdb:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdc:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdd:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xde:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdf:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe0:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe1:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe2:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe3:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe4:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe5:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe6:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe7:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe8:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe9:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xea:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xeb:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xec:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xed:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xee:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xef:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf0:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf1:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf2:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf3:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf4:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf5:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf6:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf7:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf8:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf9:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfa:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfb:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfc:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfd:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfe:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xff:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] invalid instruction opcode",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 5;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  default:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"[-][mvm] instruction opcode overflow",&local_239);
    *puVar2 = &PTR__mexcept_00178098;
    *(undefined2 *)(puVar2 + 1) = 3;
    __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (__return_storage_ptr__,&local_238);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t>
assembler<Set, MetaCodeImpl>::assemble(std::string const &line) const {
  std::istringstream iss(line);
  std::vector<std::string> tokens(std::istream_iterator<std::string>{iss},
                                  std::istream_iterator<std::string>());

  if (tokens.empty()) // need at leat an instruction name
  {
    throw mexcept("[-][mvm] no instruction token", status_type::NO_INSTR_NAME);
  }

  auto iname_it = std::find_if(
      std::cbegin(instr_set_traits_type::instr_names),
      std::cend(instr_set_traits_type::instr_names),
      [&](auto const &val) { return std::string(val) == tokens[0]; });

  if (iname_it == std::cend(instr_set_traits_type::instr_names)) {
    throw mexcept("[-][mvm] invalid instruction name",
                  status_type::BAD_INSTR_NAME);
  }

  LOG_INFO("assembler -> assemble instruction " << *iname_it);

  std::vector<uint8_t> bytecode;
  auto instr_index =
      std::distance(std::cbegin(instr_set_traits_type::instr_names), iname_it);

#ifdef FASTI
#define MVM_ASSEMBLE_I(n)                                                      \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      bytecode = assemble_instr<instr_type>(                                   \
          static_cast<uint8_t>(n),                                             \
          (tokens.erase(std::begin(tokens)), tokens));                         \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;
  switch (instr_index) {
    MVM_UNROLL_256(MVM_ASSEMBLE_I)
  default:
    throw mexcept("[-][mvm] instruction opcode overflow",
                  status_type::INSTR_OPCODE_OVERFLOW);
  }
#else
  // visitor version suitable for small instruction sets
  instr_set_visitor<instr_set_desc_type>()(
      instr_index, [&tokens, &bytecode, instr_index, this](auto &&arg) {
        using instr_type = std::decay_t<decltype(arg)>;
        tokens.erase(std::begin(tokens));
        bytecode = this->assemble_instr<instr_type>(
            static_cast<uint8_t>(instr_index), tokens);
      });
#endif

  return bytecode;
}